

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O0

bool gpt2_eval(gpt2_model *model,int n_threads,int n_past,
              vector<int,_std::allocator<int>_> *embd_inp,
              vector<float,_std::allocator<float>_> *embd_w,size_t *mem_per_token)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__dest;
  int iVar6;
  int iVar7;
  size_type sVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  int *__src;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  const_reference pvVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  vector<float,_std::allocator<float>_> *this;
  float *__dest_00;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  int *in_RDI;
  ulong *in_R9;
  double dVar19;
  undefined1 auVar20 [16];
  ggml_tensor *inpFF;
  ggml_tensor *KQV_merged;
  ggml_tensor *KQV;
  ggml_tensor *V_trans;
  ggml_tensor *KQ_soft_max;
  ggml_tensor *KQ_masked;
  ggml_tensor *KQ_scaled;
  ggml_tensor *KQ;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *cur;
  int il;
  ggml_tensor *inpL;
  int i;
  ggml_tensor *position;
  ggml_tensor *embd;
  ggml_cgraph *gf;
  ggml_context *ctx0;
  ggml_init_params params;
  size_t buf_size_new;
  int n_vocab;
  int n_head;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams;
  int N;
  size_type __new_size;
  int local_c4;
  undefined8 local_c0;
  int local_b4;
  
  sVar8 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  iVar6 = (int)sVar8;
  iVar1 = in_RDI[2];
  iVar2 = in_RDI[4];
  iVar3 = in_RDI[1];
  iVar4 = in_RDI[3];
  iVar5 = *in_RDI;
  if ((gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
       ::buf == '\0') &&
     (iVar7 = __cxa_guard_acquire(&gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
                                   ::buf), iVar7 != 0)) {
    gpt2_eval::buf = malloc(gpt2_eval::buf_size);
    __cxa_guard_release(&gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
                         ::buf);
  }
  if ((*in_R9 != 0) &&
     (gpt2_eval::buf_size <= *in_R9 * (long)iVar6 && *in_R9 * (long)iVar6 - gpt2_eval::buf_size != 0
     )) {
    lVar9 = *in_R9 * (long)iVar6;
    auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar20._0_8_ = lVar9;
    auVar20._12_4_ = 0x45300000;
    dVar19 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * 1.1;
    uVar10 = (ulong)dVar19;
    gpt2_eval::buf_size = uVar10 | (long)(dVar19 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f;
    gpt2_eval::buf = realloc(gpt2_eval::buf,gpt2_eval::buf_size);
    if (gpt2_eval::buf == (void *)0x0) {
      fprintf(_stderr,"%s: failed to allocate %zu bytes\n","gpt2_eval",gpt2_eval::buf_size);
      return false;
    }
  }
  sVar8 = ggml_init();
  uVar11 = ggml_new_graph(sVar8);
  lVar9 = ggml_new_tensor_1d(sVar8,0x1a,(long)iVar6);
  __dest = *(void **)(lVar9 + 0xf8);
  __src = std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x113490);
  lVar12 = ggml_element_size(lVar9);
  memcpy(__dest,__src,iVar6 * lVar12);
  lVar12 = ggml_new_tensor_1d(sVar8,0x1a,(long)iVar6);
  for (local_b4 = 0; local_b4 < iVar6; local_b4 = local_b4 + 1) {
    *(int *)(*(long *)(lVar12 + 0xf8) + (long)local_b4 * 4) = in_EDX + local_b4;
  }
  uVar13 = ggml_get_rows(sVar8,*(undefined8 *)(in_RDI + 0xc),lVar9);
  uVar14 = ggml_get_rows(sVar8,*(undefined8 *)(in_RDI + 0xe),lVar12);
  local_c0 = ggml_add(sVar8,uVar13,uVar14);
  for (local_c4 = 0; local_c4 < iVar2; local_c4 = local_c4 + 1) {
    uVar13 = ggml_norm(sVar8,local_c0);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_repeat(sVar8,pvVar15->ln_1_g,uVar13);
    uVar14 = ggml_mul(sVar8,uVar14,uVar13);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar13 = ggml_repeat(sVar8,pvVar15->ln_1_b,uVar13);
    uVar13 = ggml_add(sVar8,uVar14,uVar13);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar13 = ggml_mul_mat(sVar8,pvVar15->c_attn_attn_w,uVar13);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_repeat(sVar8,pvVar15->c_attn_attn_b,uVar13);
    lVar9 = ggml_add(sVar8,uVar14,uVar13);
    uVar13 = ggml_view_2d(sVar8,lVar9,(long)iVar1,(long)iVar6,*(undefined8 *)(lVar9 + 0x38),0);
    uVar14 = ggml_view_2d(sVar8,lVar9,(long)iVar1,(long)iVar6,*(undefined8 *)(lVar9 + 0x38),
                          (long)iVar1 << 2);
    uVar16 = ggml_view_2d(sVar8,lVar9,(long)iVar1,(long)iVar6,*(undefined8 *)(lVar9 + 0x38),
                          (long)iVar1 << 3);
    if (0 < iVar6) {
      uVar18 = *(undefined8 *)(in_RDI + 0x18);
      lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0x18));
      uVar17 = ggml_view_1d(sVar8,uVar18,(long)(iVar6 * iVar1),
                            lVar9 * iVar1 * (long)(local_c4 * iVar3 + in_EDX));
      uVar18 = *(undefined8 *)(in_RDI + 0x1a);
      lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0x1a));
      uVar18 = ggml_view_1d(sVar8,uVar18,(long)(iVar6 * iVar1),
                            lVar9 * iVar1 * (long)(local_c4 * iVar3 + in_EDX));
      uVar14 = ggml_cpy(sVar8,uVar14,uVar17);
      ggml_build_forward_expand(uVar11,uVar14);
      uVar14 = ggml_cpy(sVar8,uVar16,uVar18);
      ggml_build_forward_expand(uVar11,uVar14);
    }
    uVar14 = ggml_new_tensor_3d(sVar8,0,(long)(iVar1 / iVar4),(long)iVar4,(long)iVar6);
    uVar13 = ggml_cpy(sVar8,uVar13,uVar14);
    uVar14 = ggml_permute(sVar8,uVar13,0,2,1,3);
    uVar13 = *(undefined8 *)(in_RDI + 0x18);
    lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0x18));
    uVar13 = ggml_view_1d(sVar8,uVar13,(long)((in_EDX + iVar6) * iVar1),
                          (local_c4 * iVar3) * lVar9 * (long)iVar1);
    uVar13 = ggml_reshape_3d(sVar8,uVar13,(long)(iVar1 / iVar4),(long)iVar4,(long)(in_EDX + iVar6));
    uVar13 = ggml_permute(sVar8,uVar13,0,2,1,3);
    uVar13 = ggml_mul_mat(sVar8,uVar13,uVar14);
    dVar19 = sqrt((double)((float)iVar1 / (float)iVar4));
    uVar13 = ggml_scale_inplace(CONCAT44((int)((ulong)(1.0 / dVar19) >> 0x20),(float)(1.0 / dVar19))
                                ,sVar8,uVar13);
    uVar13 = ggml_diag_mask_inf_inplace(sVar8,uVar13,in_EDX);
    uVar14 = ggml_soft_max_inplace(sVar8,uVar13);
    uVar13 = *(undefined8 *)(in_RDI + 0x1a);
    lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0x1a));
    uVar13 = ggml_view_1d(sVar8,uVar13,(long)((in_EDX + iVar6) * iVar1),
                          (local_c4 * iVar3) * lVar9 * (long)iVar1);
    uVar13 = ggml_reshape_3d(sVar8,uVar13,(long)(iVar1 / iVar4),(long)iVar4,(long)(in_EDX + iVar6));
    uVar13 = ggml_permute(sVar8,uVar13,1,2,0,3);
    uVar16 = ggml_new_tensor_3d(sVar8,**(undefined4 **)(in_RDI + 0x1a),(long)(in_EDX + iVar6),
                                (long)(iVar1 / iVar4),(long)iVar4);
    uVar13 = ggml_cpy(sVar8,uVar13,uVar16);
    uVar13 = ggml_mul_mat(sVar8,uVar13,uVar14);
    uVar13 = ggml_permute(sVar8,uVar13,0,2,1,3);
    uVar14 = ggml_new_tensor_2d(sVar8,0,(long)iVar1,(long)iVar6);
    uVar13 = ggml_cpy(sVar8,uVar13,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar13 = ggml_mul_mat(sVar8,pvVar15->c_attn_proj_w,uVar13);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_repeat(sVar8,pvVar15->c_attn_proj_b,uVar13);
    uVar13 = ggml_add(sVar8,uVar14,uVar13);
    uVar13 = ggml_add(sVar8,uVar13,local_c0);
    uVar14 = ggml_norm(sVar8,uVar13);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar16 = ggml_repeat(sVar8,pvVar15->ln_2_g,uVar14);
    uVar16 = ggml_mul(sVar8,uVar16,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_repeat(sVar8,pvVar15->ln_2_b,uVar14);
    uVar14 = ggml_add(sVar8,uVar16,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_mul_mat(sVar8,pvVar15->c_mlp_fc_w,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar16 = ggml_repeat(sVar8,pvVar15->c_mlp_fc_b,uVar14);
    uVar14 = ggml_add(sVar8,uVar16,uVar14);
    uVar14 = ggml_gelu(sVar8,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar14 = ggml_mul_mat(sVar8,pvVar15->c_mlp_proj_w,uVar14);
    pvVar15 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x12),
                         (long)local_c4);
    uVar16 = ggml_repeat(sVar8,pvVar15->c_mlp_proj_b,uVar14);
    uVar14 = ggml_add(sVar8,uVar16,uVar14);
    local_c0 = ggml_add(sVar8,uVar14,uVar13);
  }
  uVar13 = ggml_norm(sVar8,local_c0);
  __new_size = sVar8;
  uVar14 = ggml_repeat(sVar8,*(undefined8 *)(in_RDI + 8),uVar13);
  this = (vector<float,_std::allocator<float>_> *)ggml_mul(sVar8,uVar14,uVar13);
  uVar13 = ggml_repeat(sVar8,*(undefined8 *)(in_RDI + 10),uVar13);
  uVar13 = ggml_add(__new_size,this,uVar13);
  uVar13 = ggml_mul_mat(sVar8,*(undefined8 *)(in_RDI + 0x10),uVar13);
  ggml_build_forward_expand(uVar11,uVar13);
  ggml_graph_compute_with_ctx(sVar8,uVar11,in_ESI);
  std::vector<float,_std::allocator<float>_>::resize(this,__new_size);
  __dest_00 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x114416);
  lVar9 = ggml_get_data(uVar13);
  memcpy(__dest_00,(void *)(lVar9 + (long)(iVar5 * (iVar6 + -1)) * 4),(long)iVar5 << 2);
  if (*in_R9 == 0) {
    uVar10 = ggml_used_mem(sVar8);
    *in_R9 = uVar10 / (ulong)(long)iVar6;
  }
  ggml_free(sVar8);
  return true;
}

Assistant:

bool gpt2_eval(
        const gpt2_model & model,
        const int n_threads,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp,
              std::vector<float>         & embd_w,
              size_t                     & mem_per_token) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;
    const int n_vocab = hparams.n_vocab;

    static size_t buf_size = 256u*1024*1024;
    static void * buf = malloc(buf_size);

    if (mem_per_token > 0 && mem_per_token*N > buf_size) {
        const size_t buf_size_new = 1.1*(mem_per_token*N); // add 10% to account for ggml object overhead
        //printf("\n%s: reallocating buffer from %zu to %zu bytes\n", __func__, buf_size, buf_size_new);

        // reallocate
        buf_size = buf_size_new;
        buf = realloc(buf, buf_size);
        if (buf == nullptr) {
            fprintf(stderr, "%s: failed to allocate %zu bytes\n", __func__, buf_size);
            return false;
        }
    }

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf,
        /*.no_alloc   =*/ false,
    };

    struct ggml_context * ctx0 = ggml_init(params);
    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    memcpy(embd->data, embd_inp.data(), N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    for (int i = 0; i < N; ++i) {
        ((int32_t *) position->data)[i] = n_past + i;
    }

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx0,
                ggml_get_rows(ctx0, model.wte, embd),
                ggml_get_rows(ctx0, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx0, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx0,
                    ggml_mul(ctx0,
                        ggml_repeat(ctx0, model.layers[il].ln_1_g, cur),
                        cur),
                    ggml_repeat(ctx0, model.layers[il].ln_1_b, cur));
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_attn_b, cur),
                    cur);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx0, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx0, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx0,
                        ggml_cpy(ctx0,
                            Qcur,
                            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_embd/n_head, n_head, N)),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx0,
                        ggml_reshape_3d(ctx0,
                            ggml_view_1d(ctx0, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale_inplace(ctx0, KQ, 1.0f/sqrt(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf_inplace(ctx0, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max_inplace(ctx0, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cpy(ctx0,
                        ggml_permute(ctx0,
                            ggml_reshape_3d(ctx0,
                                ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        ggml_new_tensor_3d(ctx0, model.memory_v->type, n_past + N, n_embd/n_head, n_head));

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cpy(ctx0,
                    KQV_merged,
                    ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, N));
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_proj_b, cur),
                    cur);
        }

        // add the input
        cur = ggml_add(ctx0, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx0, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx0,
                        ggml_mul(ctx0,
                            ggml_repeat(ctx0, model.layers[il].ln_2_g, cur),
                            cur),
                        ggml_repeat(ctx0, model.layers[il].ln_2_b, cur));
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_fc_b, cur),
                    cur);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx0, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_proj_b, cur),
                    cur);
        }

        // input for next layer
        inpL = ggml_add(ctx0, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx0, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx0,
                ggml_mul(ctx0,
                    ggml_repeat(ctx0, model.ln_f_g, inpL),
                    inpL),
                ggml_repeat(ctx0, model.ln_f_b, inpL));
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx0, model.lm_head, inpL);

    // logits -> probs
    //inpL = ggml_soft_max_inplace(ctx0, inpL);

    // run the computation
    ggml_build_forward_expand(gf, inpL);
    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    //embd_w.resize(n_vocab*N);
    //memcpy(embd_w.data(), ggml_get_data(inpL), sizeof(float)*n_vocab*N);

    // return result just for the last token
    embd_w.resize(n_vocab);
    memcpy(embd_w.data(), (float *) ggml_get_data(inpL) + (n_vocab*(N-1)), sizeof(float)*n_vocab);

    if (mem_per_token == 0) {
        mem_per_token = ggml_used_mem(ctx0)/N;
    }
    //printf("used_mem = %zu\n", ggml_used_mem(ctx0));

    ggml_free(ctx0);

    return true;
}